

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmathlib.c
# Opt level: O2

int math_modf(lua_State *L)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  lua_Number lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [64];
  undefined1 extraout_var [56];
  
  iVar5 = lua_isinteger(L,1);
  if (iVar5 == 0) {
    auVar8._0_8_ = luaL_checknumber(L,1);
    auVar8._8_56_ = extraout_var;
    auVar7 = auVar8._0_16_;
    auVar1 = vroundsd_avx(auVar7,auVar7,10);
    auVar2 = vroundsd_avx(auVar7,auVar7,9);
    uVar3 = vcmpsd_avx512f(auVar7,ZEXT816(0) << 0x40,1);
    bVar4 = (bool)((byte)uVar3 & 1);
    lVar6 = (lua_Number)((ulong)bVar4 * auVar1._0_8_ + (ulong)!bVar4 * auVar2._0_8_);
    pushnumint(L,lVar6);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = auVar8._0_8_;
    auVar1._8_8_ = auVar2._8_8_;
    auVar1._0_8_ = lVar6;
    uVar3 = vcmpsd_avx512f(auVar7,auVar1,0);
    lVar6 = (lua_Number)((ulong)!(bool)((byte)uVar3 & 1) * (long)(auVar8._0_8_ - lVar6));
  }
  else {
    lua_settop(L,1);
    lVar6 = 0.0;
  }
  lua_pushnumber(L,lVar6);
  return 2;
}

Assistant:

static int math_modf (lua_State *L) {
  if (lua_isinteger(L ,1)) {
    lua_settop(L, 1);  /* number is its own integer part */
    lua_pushnumber(L, 0);  /* no fractional part */
  }
  else {
    lua_Number n = luaL_checknumber(L, 1);
    /* integer part (rounds toward zero) */
    lua_Number ip = (n < 0) ? l_mathop(ceil)(n) : l_mathop(floor)(n);
    pushnumint(L, ip);
    /* fractional part (test needed for inf/-inf) */
    lua_pushnumber(L, (n == ip) ? l_mathop(0.0) : (n - ip));
  }
  return 2;
}